

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall kj::HttpServer::drain(HttpServer *this)

{
  undefined8 *puVar1;
  long *plVar2;
  Timer *pTVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_00;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_01;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_02;
  ImmediatePromiseNode<kj::_::Void> *pIVar6;
  long in_RSI;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar7;
  Promise<void> PVar8;
  PromiseFulfillerPair<void> paf;
  ErrorHandler local_38;
  Timer *pTStack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined8 uStack_20;
  
  if (*(char *)(in_RSI + 0x50) != '\x01') {
    *(undefined1 *)(in_RSI + 0x50) = 1;
    (**(code **)**(undefined8 **)(in_RSI + 0x70))(*(undefined8 **)(in_RSI + 0x70),&local_38);
    if (*(int *)(in_RSI + 0x78) == 0) {
      OVar7 = heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_38);
      pIVar6 = OVar7.ptr;
      (this->super_ErrorHandler)._vptr_ErrorHandler = local_38._vptr_ErrorHandler;
      this->timer = pTStack_30;
    }
    else {
      newPromiseAndFulfiller<void>();
      uVar4 = (undefined4)uStack_20;
      uVar5 = uStack_20._4_4_;
      uStack_20 = (long *)0x0;
      puVar1 = *(undefined8 **)(in_RSI + 0x80);
      plVar2 = *(long **)(in_RSI + 0x88);
      *(undefined4 *)(in_RSI + 0x80) = local_28;
      *(undefined4 *)(in_RSI + 0x84) = uStack_24;
      *(undefined4 *)(in_RSI + 0x88) = uVar4;
      *(undefined4 *)(in_RSI + 0x8c) = uVar5;
      pIVar6 = extraout_RDX;
      if (plVar2 != (long *)0x0) {
        (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10));
        pIVar6 = extraout_RDX_00;
      }
      plVar2 = uStack_20;
      (this->super_ErrorHandler)._vptr_ErrorHandler = local_38._vptr_ErrorHandler;
      this->timer = pTStack_30;
      pTStack_30 = (Timer *)0x0;
      if (uStack_20 != (long *)0x0) {
        uStack_20 = (long *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_24,local_28))
                  ((undefined8 *)CONCAT44(uStack_24,local_28),
                   (long)plVar2 + *(long *)(*plVar2 + -0x10));
        pIVar6 = extraout_RDX_01;
      }
      pTVar3 = pTStack_30;
      if (pTStack_30 != (Timer *)0x0) {
        pTStack_30 = (Timer *)0x0;
        (**(code **)*local_38._vptr_ErrorHandler)
                  (local_38._vptr_ErrorHandler,(long)pTVar3 + *(long *)(*(long *)pTVar3 + -0x10));
        pIVar6 = extraout_RDX_02;
      }
    }
    PVar8.super_PromiseBase.node.ptr = (PromiseNode *)pIVar6;
    PVar8.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<void>)PVar8.super_PromiseBase.node;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
            ((Fault *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x13b6,FAILED,"!draining","\"you can only call drain() once\"",
             (char (*) [31])"you can only call drain() once");
  _::Debug::Fault::fatal((Fault *)&local_38);
}

Assistant:

kj::Promise<void> HttpServer::drain() {
  KJ_REQUIRE(!draining, "you can only call drain() once");

  draining = true;
  drainFulfiller->fulfill();

  if (connectionCount == 0) {
    return kj::READY_NOW;
  } else {
    auto paf = kj::newPromiseAndFulfiller<void>();
    zeroConnectionsFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}